

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

clip_image_size
image_manipulation::calc_size_preserved_ratio
          (clip_image_size *inp_size,int align_size,int max_dimension)

{
  clip_image_size cVar1;
  float *pfVar2;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  int aligned_height;
  int aligned_width;
  float target_height_f;
  float target_width_f;
  float scale;
  float local_28;
  float local_24;
  float local_20 [3];
  int local_14;
  int *local_10;
  uint local_8;
  uint uStack_4;
  
  if ((((*in_RDI < 1) || (in_RDI[1] < 1)) || (in_ESI < 1)) || (in_EDX < 1)) {
    local_8 = 0;
    uStack_4 = 0;
  }
  else {
    local_20[0] = 1.0;
    local_24 = (float)in_EDX / (float)*in_RDI;
    local_28 = (float)in_EDX / (float)in_RDI[1];
    local_14 = in_ESI;
    local_10 = in_RDI;
    pfVar2 = std::min<float>(&local_24,&local_28);
    pfVar2 = std::min<float>(local_20,pfVar2);
    local_8 = ((int)((float)*local_10 * *pfVar2) + local_14) - 1U & (local_14 - 1U ^ 0xffffffff);
    uStack_4 = ((int)((float)local_10[1] * *pfVar2) + local_14) - 1U & (local_14 - 1U ^ 0xffffffff);
  }
  cVar1.height = uStack_4;
  cVar1.width = local_8;
  return cVar1;
}

Assistant:

static clip_image_size calc_size_preserved_ratio(const clip_image_size & inp_size, const int align_size, const int max_dimension) {
        if (inp_size.width <= 0 || inp_size.height <= 0 || align_size <= 0 || max_dimension <= 0) {
            return {0, 0};
        }

        float scale = std::min(1.0f, std::min(static_cast<float>(max_dimension) / inp_size.width,
                                              static_cast<float>(max_dimension) / inp_size.height));

        float target_width_f  = static_cast<float>(inp_size.width)  * scale;
        float target_height_f = static_cast<float>(inp_size.height) * scale;

        int aligned_width  = GGML_PAD((int)target_width_f,  align_size);
        int aligned_height = GGML_PAD((int)target_height_f, align_size);

        return {aligned_width, aligned_height};
    }